

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O2

Solution * ConstructionHeuristics::FirstFit(Solution *solution,string *skillId)

{
  pointer pvVar1;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar2;
  const_reverse_iterator dayIndex;
  pointer pvVar3;
  long lVar4;
  
  pvVar2 = Solution::getTurns(solution);
  pvVar3 = (pvVar2->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = Solution::getTurns(solution);
  pvVar1 = (pvVar2->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)pvVar3 - (long)pvVar1;
  for (; pvVar3 != pvVar1; pvVar3 = pvVar3 + -1) {
    assignGivenDay(solution,(int)(lVar4 / 0x18) - 1,skillId);
    lVar4 = lVar4 + -0x18;
  }
  return solution;
}

Assistant:

Solution *ConstructionHeuristics::FirstFit(Solution *solution, const string &skillId) {
    auto rbegin = solution->getTurns().rbegin();
    auto rend = solution->getTurns().rend();

    for (auto dayIndex = rbegin; dayIndex != rend; dayIndex++)
        assignGivenDay(solution, (unsigned int) distance(dayIndex, rend)-1, skillId);

    return solution;
}